

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotDiff.cpp
# Opt level: O2

void __thiscall OpenMD::PotDiff::PotDiff(PotDiff *this,SimInfo *info,string *filename,string *sele)

{
  SelectionManager *this_00;
  SelectionEvaluator *this_01;
  int rigidBodyStorageLayout;
  int cutoffGroupStorageLayout;
  SimInfo *info_00;
  bool bVar1;
  SimSnapshotManager *this_02;
  StuntDouble *pSVar2;
  uint atomStorageLayout;
  int i;
  PotDiff *local_b8;
  FluctuatingChargeAdapter fqa;
  string local_80;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_60;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,1);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__PotDiff_002ee1b8;
  (this->diff_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->diff_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->diff_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->data_).Count_ = 0;
  (this->data_).Val_ = 0.0;
  (this->data_).Total_ = 0.0;
  (this->data_).Max_ = 0.0;
  (this->data_).Min_ = 0.0;
  (this->data_).Avg_ = 0.0;
  (this->data_).Avg2_ = 0.0;
  std::__cxx11::string::string((string *)&this->selectionScript_,(string *)sele);
  this_00 = &this->seleMan_;
  SelectionManager::SelectionManager(this_00,info);
  this_01 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  (this->selectionWasFlucQ_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->selectionWasFlucQ_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->selectionWasFlucQ_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->selectionWasFlucQ_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->selectionWasFlucQ_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_b8 = this;
  getPrefix(&local_80,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fqa,&local_80
                 ,".potDiff");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&fqa);
  std::__cxx11::string::~string((string *)&local_80);
  info_00 = (this->super_StaticAnalyser).info_;
  rigidBodyStorageLayout = info->rigidBodyStorageLayout_;
  cutoffGroupStorageLayout = info->cutoffGroupStorageLayout_;
  atomStorageLayout = info_00->atomStorageLayout_ | 0x1c000;
  info_00->atomStorageLayout_ = atomStorageLayout;
  this_02 = (SimSnapshotManager *)operator_new(0x30);
  SimSnapshotManager::SimSnapshotManager
            (this_02,info_00,atomStorageLayout,rigidBodyStorageLayout,cutoffGroupStorageLayout);
  SimInfo::setSnapshotManager(info_00,(SnapshotManager *)this_02);
  SelectionEvaluator::loadScriptString(this_01,sele);
  SelectionEvaluator::evaluate((SelectionSet *)&fqa,this_01);
  SelectionManager::setSelectionSet(this_00,(SelectionSet *)&fqa);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&fqa);
  pSVar2 = SelectionManager::beginSelected(this_00,&i);
  while (pSVar2 != (StuntDouble *)0x0) {
    fqa.at_ = (AtomType *)pSVar2[1]._vptr_StuntDouble;
    bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge(&fqa);
    if (bVar1) {
      std::vector<bool,_std::allocator<bool>_>::push_back(&this->selectionWasFlucQ_,true);
    }
    else {
      std::vector<bool,_std::allocator<bool>_>::push_back(&this->selectionWasFlucQ_,false);
      Polynomial<double>::Polynomial((Polynomial<double> *)&local_60,1.0);
      FluctuatingChargeAdapter::makeFluctuatingCharge
                (&fqa,1000000000.0,0.0,0.0,(DoublePolynomial *)&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::~_Rb_tree(&local_60);
      *(undefined8 *)
       (*(long *)((long)&(pSVar2->snapshotMan_->currentSnapshot_->atomData).flucQPos.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + pSVar2->storage_) +
       (long)pSVar2->localIndex_ * 8) = 0;
    }
    pSVar2 = SelectionManager::nextSelected(this_00,&i);
  }
  (*((local_b8->super_StaticAnalyser).info_)->sman_->_vptr_SnapshotManager[2])();
  return;
}

Assistant:

PotDiff::PotDiff(SimInfo* info, const std::string& filename,
                   const std::string& sele) :
      StaticAnalyser(info, filename, 1),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    StuntDouble* sd;
    int i;

    setOutputName(getPrefix(filename) + ".potDiff");

    // The PotDiff is computed by negating the charge on the atom type
    // using fluctuating charge values.  If we don't have any
    // fluctuating charges in the simulation, we need to expand
    // storage to hold them.
    int atomStorageLayout        = info_->getAtomStorageLayout();
    int rigidBodyStorageLayout   = info->getRigidBodyStorageLayout();
    int cutoffGroupStorageLayout = info->getCutoffGroupStorageLayout();

    atomStorageLayout |= DataStorage::dslFlucQPosition;
    atomStorageLayout |= DataStorage::dslFlucQVelocity;
    atomStorageLayout |= DataStorage::dslFlucQForce;

    info_->setAtomStorageLayout(atomStorageLayout);
    info_->setSnapshotManager(new SimSnapshotManager(info_, atomStorageLayout,
                                                     rigidBodyStorageLayout,
                                                     cutoffGroupStorageLayout));

    // now we have to figure out which AtomTypes to convert to fluctuating
    // charges
    evaluator_.loadScriptString(sele);
    seleMan_.setSelectionSet(evaluator_.evaluate());
    for (sd = seleMan_.beginSelected(i); sd != NULL;
         sd = seleMan_.nextSelected(i)) {
      AtomType* at                 = static_cast<Atom*>(sd)->getAtomType();
      FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(at);
      if (fqa.isFluctuatingCharge()) {
        selectionWasFlucQ_.push_back(true);
      } else {
        selectionWasFlucQ_.push_back(false);
        // make a fictitious fluctuating charge with an unphysical
        // charge mass and slaterN, but we need to zero out the
        // electronegativity and hardness to remove the self
        // contribution:
        fqa.makeFluctuatingCharge(1.0e9, 0.0, 0.0, 1);
        sd->setFlucQPos(0.0);
      }
    }
    info_->getSnapshotManager()->advance();
  }